

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

char * skip(char **buf,char *delimiters)

{
  char *__s;
  size_t sVar1;
  char *pcVar2;
  char *__s_00;
  
  __s = *buf;
  sVar1 = strcspn(__s,delimiters);
  __s_00 = __s + sVar1;
  sVar1 = strspn(__s_00,delimiters);
  pcVar2 = __s_00 + sVar1;
  for (; __s_00 < pcVar2; __s_00 = __s_00 + 1) {
    *__s_00 = '\0';
  }
  *buf = pcVar2;
  return __s;
}

Assistant:

static char *skip(char **buf, const char *delimiters) {
  char *p, *begin_word, *end_word, *end_delimiters;

  begin_word = *buf;
  end_word = begin_word + strcspn(begin_word, delimiters);
  end_delimiters = end_word + strspn(end_word, delimiters);

  for (p = end_word; p < end_delimiters; p++) {
    *p = '\0';
  }

  *buf = end_delimiters;

  return begin_word;
}